

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::FieldDescriptorProto::SharedDtor(MessageLite *self)

{
  FieldOptions *this;
  Arena *pAVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  FieldDescriptorProto *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (FieldDescriptorProto *)self;
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  pAVar1 = MessageLite::GetArena(local_18);
  if (pAVar1 == (Arena *)0x0) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&local_18[1]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(local_18 + 2));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&local_18[2]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(local_18 + 3));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&local_18[3]._internal_metadata_);
    this = (FieldOptions *)local_18[4]._vptr_MessageLite;
    if (this != (FieldOptions *)0x0) {
      FieldOptions::~FieldOptions(this);
      operator_delete(this,0x98);
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0x14f2,"this_.GetArena() == nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void FieldDescriptorProto::SharedDtor(MessageLite& self) {
  FieldDescriptorProto& this_ = static_cast<FieldDescriptorProto&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.name_.Destroy();
  this_._impl_.extendee_.Destroy();
  this_._impl_.type_name_.Destroy();
  this_._impl_.default_value_.Destroy();
  this_._impl_.json_name_.Destroy();
  delete this_._impl_.options_;
  this_._impl_.~Impl_();
}